

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall
gflags::anon_unknown_2::CommandLineFlag::CopyFrom(CommandLineFlag *this,CommandLineFlag *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FlagValue *pFVar5;
  bool bVar6;
  
  if (this->modified_ != src->modified_) {
    this->modified_ = src->modified_;
  }
  pFVar5 = this->current_;
  uVar1._0_1_ = pFVar5->type_;
  uVar1._1_1_ = pFVar5->owns_value_;
  uVar1._2_2_ = *(undefined2 *)&pFVar5->field_0xa;
  bVar6 = FlagValue::Equal((FlagValue *)pFVar5->value_buffer_,(FlagValue *)(ulong)uVar1);
  if (!bVar6) {
    pFVar5 = this->current_;
    uVar2._0_1_ = pFVar5->type_;
    uVar2._1_1_ = pFVar5->owns_value_;
    uVar2._2_2_ = *(undefined2 *)&pFVar5->field_0xa;
    FlagValue::CopyFrom((FlagValue *)pFVar5->value_buffer_,(FlagValue *)(ulong)uVar2);
  }
  pFVar5 = this->defvalue_;
  uVar3._0_1_ = pFVar5->type_;
  uVar3._1_1_ = pFVar5->owns_value_;
  uVar3._2_2_ = *(undefined2 *)&pFVar5->field_0xa;
  bVar6 = FlagValue::Equal((FlagValue *)pFVar5->value_buffer_,(FlagValue *)(ulong)uVar3);
  if (!bVar6) {
    pFVar5 = this->defvalue_;
    uVar4._0_1_ = pFVar5->type_;
    uVar4._1_1_ = pFVar5->owns_value_;
    uVar4._2_2_ = *(undefined2 *)&pFVar5->field_0xa;
    FlagValue::CopyFrom((FlagValue *)pFVar5->value_buffer_,(FlagValue *)(ulong)uVar4);
  }
  if (this->validate_fn_proto_ != src->validate_fn_proto_) {
    this->validate_fn_proto_ = src->validate_fn_proto_;
  }
  return;
}

Assistant:

void CommandLineFlag::CopyFrom(const CommandLineFlag& src) {
  // Note we only copy the non-const members; others are fixed at construct time
  if (modified_ != src.modified_) modified_ = src.modified_;
  if (!current_->Equal(*src.current_)) current_->CopyFrom(*src.current_);
  if (!defvalue_->Equal(*src.defvalue_)) defvalue_->CopyFrom(*src.defvalue_);
  if (validate_fn_proto_ != src.validate_fn_proto_)
    validate_fn_proto_ = src.validate_fn_proto_;
}